

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::print_const_value
          (t_cpp_generator *this,ostream *out,string *name,t_type *type,t_const_value *value)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  _Rb_tree_node_base *p_Var4;
  char cVar5;
  int iVar6;
  t_const_value *ptVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long *plVar12;
  t_type *type_00;
  ulong uVar13;
  t_const_value *ptVar14;
  _Rb_tree_node_base *p_Var15;
  pointer pptVar16;
  bool bVar17;
  string v2;
  string val_1;
  _Alloc_hider in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  string local_148;
  ostream *local_128;
  _Rb_tree_node_base *local_120;
  ulong local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  t_type *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  _Base_ptr local_90 [2];
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  void ***local_50 [2];
  void **local_40 [2];
  
  ptVar7 = (t_const_value *)t_type::get_true_type(type);
  cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x28))(ptVar7);
  if (cVar5 == '\0') {
    cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x50))(ptVar7);
    if (cVar5 == '\0') {
      cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x58))(ptVar7);
      if ((cVar5 == '\0') &&
         (cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x60))(ptVar7),
         cVar5 == '\0')) {
        cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x80))(ptVar7);
        if (cVar5 == '\0') {
          cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x70))(ptVar7);
          if (cVar5 == '\0') {
            cVar5 = (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x78))(ptVar7);
            if (cVar5 == '\0') {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x18))(ptVar7);
              std::operator+(pbVar10,"INVALID TYPE IN print_const_value: ",pbVar11);
              __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            pptVar16 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar7 = *(t_const_value **)
                        &ptVar7[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
              do {
                pcVar1 = (name->_M_dataplus)._M_p;
                local_d0 = local_c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
                name_05._M_string_length = in_stack_fffffffffffffe90;
                name_05._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
                name_05.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
                name_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
                name_05.field_2._8_4_ = in_stack_fffffffffffffea0;
                name_05.field_2._12_4_ = in_stack_fffffffffffffea4;
                render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_05,type,ptVar7);
                if (local_d0 != local_c0) {
                  operator_delete(local_d0);
                }
                poVar8 = t_generator::indent((t_generator *)this,out);
                type = (t_type *)name;
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,".insert(",8);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                  operator_delete(in_stack_fffffffffffffe88._M_p);
                }
                pptVar16 = pptVar16 + 1;
              } while (pptVar16 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
          else {
            pptVar16 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar7 = *(t_const_value **)
                        &ptVar7[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
              do {
                pcVar1 = (name->_M_dataplus)._M_p;
                local_b0[0] = local_a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_b0,pcVar1,pcVar1 + name->_M_string_length);
                name_04._M_string_length = in_stack_fffffffffffffe90;
                name_04._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
                name_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
                name_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
                name_04.field_2._8_4_ = in_stack_fffffffffffffea0;
                name_04.field_2._12_4_ = in_stack_fffffffffffffea4;
                render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_04,type,ptVar7);
                if (local_b0[0] != local_a0) {
                  operator_delete(local_b0[0]);
                }
                poVar8 = t_generator::indent((t_generator *)this,out);
                type = (t_type *)name;
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,".push_back(",0xb);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                  operator_delete(in_stack_fffffffffffffe88._M_p);
                }
                pptVar16 = pptVar16 + 1;
              } while (pptVar16 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
        }
        else {
          p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_120 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (p_Var9 != local_120) {
            ptVar14 = *(t_const_value **)
                       &ptVar7[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
            ptVar7 = (t_const_value *)
                     ptVar7[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              pcVar1 = (name->_M_dataplus)._M_p;
              local_90[0] = (_Base_ptr)local_80;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_90,pcVar1,pcVar1 + name->_M_string_length);
              name_02._M_string_length = in_stack_fffffffffffffe90;
              name_02._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
              name_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
              name_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
              name_02.field_2._8_4_ = in_stack_fffffffffffffea0;
              name_02.field_2._12_4_ = in_stack_fffffffffffffea4;
              render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_02,type,ptVar14);
              if (local_90[0] != (_Base_ptr)local_80) {
                operator_delete(local_90[0]);
              }
              local_110[0] = local_100;
              pcVar1 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_110,pcVar1,pcVar1 + name->_M_string_length);
              name_03._M_string_length = in_stack_fffffffffffffe90;
              name_03._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
              name_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
              name_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
              name_03.field_2._8_4_ = in_stack_fffffffffffffea0;
              name_03.field_2._12_4_ = in_stack_fffffffffffffea4;
              render_const_value(&local_148,this,out,name_03,type,ptVar7);
              if (local_110[0] != local_100) {
                operator_delete(local_110[0]);
              }
              poVar8 = t_generator::indent((t_generator *)this,out);
              type = (t_type *)name;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,".insert(std::make_pair(",0x17);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"));",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p);
              }
              if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                operator_delete(in_stack_fffffffffffffe88._M_p);
              }
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            } while (p_Var9 != local_120);
          }
        }
      }
      else {
        p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_128 = out;
        p_Var4 = p_Var15;
        if (p_Var9 != p_Var15) {
          do {
            local_120 = p_Var4;
            plVar12 = *(long **)&(ptVar7->identifierVal_).field_2;
            if (plVar12 == *(long **)((long)&(ptVar7->identifierVal_).field_2 + 8)) {
              ptVar14 = (t_const_value *)0x0;
              local_118 = 0;
              uVar13 = local_118;
            }
            else {
              uVar13 = 0;
              ptVar14 = (t_const_value *)0x0;
              do {
                lVar2 = *plVar12;
                in_stack_fffffffffffffe88._M_p = &stack0xfffffffffffffe98;
                lVar3 = *(long *)(*(long *)(p_Var9 + 1) + 0x48);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&stack0xfffffffffffffe88,lVar3,
                           *(long *)(*(long *)(p_Var9 + 1) + 0x50) + lVar3);
                __n = *(size_t *)(lVar2 + 0x70);
                if (__n == in_stack_fffffffffffffe90) {
                  if (__n == 0) {
                    bVar17 = true;
                  }
                  else {
                    iVar6 = bcmp(*(void **)(lVar2 + 0x68),in_stack_fffffffffffffe88._M_p,__n);
                    bVar17 = iVar6 == 0;
                  }
                }
                else {
                  bVar17 = false;
                }
                if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                  operator_delete(in_stack_fffffffffffffe88._M_p);
                }
                if (bVar17) {
                  ptVar14 = *(t_const_value **)(*plVar12 + 0x60);
                  uVar13 = (ulong)(*(int *)(*plVar12 + 0x8c) != 0);
                }
                plVar12 = plVar12 + 1;
                p_Var15 = local_120;
              } while (plVar12 != *(long **)((long)&(ptVar7->identifierVal_).field_2 + 8));
            }
            local_118 = uVar13;
            if (ptVar14 == (t_const_value *)0x0) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar7->mapVal_)._M_t._M_impl + 0x18))(ptVar7);
              std::operator+(&local_148,"type error: ",pbVar11);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_148);
              *plVar12 = (long)(plVar12 + 2);
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              local_70._0_8_ = local_70 + 0x10;
              lVar2 = *(long *)(*(long *)(p_Var9 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_80 + 0x10),lVar2,
                         *(long *)(*(long *)(p_Var9 + 1) + 0x50) + lVar2);
              std::operator+(pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&stack0xfffffffffffffe88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_80 + 0x10));
              __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            pcVar1 = (name->_M_dataplus)._M_p;
            type_00 = (t_type *)local_e0;
            local_f0[0] = (t_type *)local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,pcVar1,pcVar1 + name->_M_string_length);
            name_01._M_string_length = in_stack_fffffffffffffe90;
            name_01._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
            name_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
            name_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
            name_01.field_2._8_4_ = in_stack_fffffffffffffea0;
            name_01.field_2._12_4_ = in_stack_fffffffffffffea4;
            render_const_value((string *)&stack0xfffffffffffffe88,this,local_128,name_01,type_00,
                               ptVar14);
            if (local_f0[0] != (t_type *)local_e0) {
              operator_delete(local_f0[0]);
            }
            poVar8 = t_generator::indent((t_generator *)this,local_128);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            lVar2 = *(long *)(*(long *)(p_Var9 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,lVar2,*(long *)(*(long *)(p_Var9 + 1) + 0x50) + lVar2);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            if ((local_118 & 1) != 0) {
              poVar8 = t_generator::indent((t_generator *)this,local_128);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,".__isset.",9);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              lVar2 = *(long *)(*(long *)(p_Var9 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_148,lVar2,*(long *)(*(long *)(p_Var9 + 1) + 0x50) + lVar2)
              ;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," = true;",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p);
              }
            }
            if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
              operator_delete(in_stack_fffffffffffffe88._M_p);
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            out = local_128;
            p_Var4 = local_120;
          } while (p_Var9 != p_Var15);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      return;
    }
    poVar8 = t_generator::indent((t_generator *)this,out);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = (",4);
    type_name_abi_cxx11_((string *)&stack0xfffffffffffffe88,this,(t_type *)ptVar7,false,false);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    t_const_value::get_integer(value);
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50[0] = local_50 + 2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + name->_M_string_length);
    name_00._M_string_length = in_stack_fffffffffffffe90;
    name_00._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
    name_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
    name_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
    name_00.field_2._8_4_ = in_stack_fffffffffffffea0;
    name_00.field_2._12_4_ = in_stack_fffffffffffffea4;
    render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_00,type,ptVar7);
    if ((void ****)local_50[0] != local_50 + 2) {
      operator_delete(local_50[0]);
    }
    poVar8 = t_generator::indent((t_generator *)this,out);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
    operator_delete(in_stack_fffffffffffffe88._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::print_const_value(ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value) {
  type = get_true_type(type);
  if (type->is_base_type()) {
    string v2 = render_const_value(out, name, type, value);
    indent(out) << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = (" << type_name(type) << ")" << value->get_integer() << ";" << endl
                << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    bool is_nonrequired_field = false;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      is_nonrequired_field = false;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
          is_nonrequired_field = (*f_iter)->get_req() != t_field::T_REQUIRED;
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      indent(out) << name << "." << v_iter->first->get_string() << " = " << val << ";" << endl;
      if (is_nonrequired_field) {
        indent(out) << name << ".__isset." << v_iter->first->get_string() << " = true;" << endl;
      }
    }
    out << endl;
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << name << ".insert(std::make_pair(" << key << ", " << val << "));" << endl;
    }
    out << endl;
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".push_back(" << val << ");" << endl;
    }
    out << endl;
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".insert(" << val << ");" << endl;
    }
    out << endl;
  } else {
    throw "INVALID TYPE IN print_const_value: " + type->get_name();
  }
}